

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

ssize_t __thiscall Instance::write(Instance *this,int __fd,void *__buf,size_t __n)

{
  pointer pIVar1;
  int *piVar2;
  pointer piVar3;
  size_t sVar4;
  size_t extraout_RAX;
  uint uVar5;
  int i;
  undefined4 in_register_00000034;
  FILE *__s;
  ulong uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  vector<int,_std::allocator<int>_> rid;
  allocator_type local_51;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  __s = (FILE *)CONCAT44(in_register_00000034,__fd);
  fwrite("#INSTANCE_BEGIN#\n",0x11,1,__s);
  fwrite("$INSTANCE{\n",0xb,1,__s);
  fprintf(__s,"%d\n",(ulong)(uint)this->ndims);
  fprintf(__s,"%d\n",(ulong)(uint)this->nbtypes);
  if (0 < this->nbtypes) {
    lVar9 = 0;
    do {
      if (0 < this->ndims) {
        lVar7 = 0;
        do {
          fprintf(__s," %d",
                  (ulong)*(uint *)(*(long *)&(this->Ws).
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar9].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data + lVar7 * 4));
          lVar7 = lVar7 + 1;
        } while (lVar7 < this->ndims);
      }
      fprintf(__s," %d",
              (ulong)(uint)(this->Cs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar9]);
      fprintf(__s," %d\n",
              (ulong)(uint)(this->Qs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar9]);
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->nbtypes);
  }
  fprintf(__s,"%d\n",(ulong)(uint)this->m);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,
             ((long)(this->items).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->items).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,&local_51);
  pIVar1 = (this->items).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (int)((long)(this->items).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pIVar1 >> 3) * 0x38e38e39;
  if (0 < (int)uVar5) {
    piVar2 = &pIVar1->id;
    uVar6 = 0;
    do {
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[*piVar2] = (int)uVar6;
      uVar6 = uVar6 + 1;
      piVar2 = piVar2 + 0x12;
    } while ((uVar5 & 0x7fffffff) != uVar6);
  }
  if (0 < this->m) {
    piVar3 = (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    lVar7 = 0;
    do {
      fprintf(__s,"%d %d\n",(ulong)(uint)piVar3[lVar9],
              (ulong)(uint)(this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar9]);
      piVar3 = (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < piVar3[lVar9]) {
        lVar7 = (long)(int)lVar7;
        iVar8 = 0;
        local_50 = lVar9;
        do {
          if (0 < this->ndims) {
            i = 0;
            do {
              uVar5 = Item::operator[]((this->items).super__Vector_base<Item,_std::allocator<Item>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                                       local_48.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start[lVar7],i);
              fprintf(__s," %d",(ulong)uVar5);
              i = i + 1;
            } while (i < this->ndims);
          }
          fputc(10,__s);
          lVar7 = lVar7 + 1;
          iVar8 = iVar8 + 1;
          piVar3 = (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar9 = local_50;
        } while (iVar8 < piVar3[local_50]);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->m);
  }
  fwrite("};\n",3,1,__s);
  fprintf(__s,"$VTYPE{%c};\n",(ulong)(uint)(int)this->vtype);
  fwrite("$CTYPE{",7,1,__s);
  if (0 < this->m) {
    lVar9 = 0;
    do {
      if (lVar9 != 0) {
        fputc(0x2c,__s);
      }
      fputc((int)(this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9],__s);
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->m);
  }
  fwrite("};\n",3,1,__s);
  fprintf(__s,"$METHOD{%d};\n",(ulong)(uint)this->method);
  fprintf(__s,"$RELAX{%d};\n",(ulong)this->relax_domains);
  fprintf(__s,"$BINARY{%d};\n",(ulong)this->binary);
  sVar4 = fwrite("#INSTANCE_END#\n",0xf,1,__s);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
    sVar4 = extraout_RAX;
  }
  return sVar4;
}

Assistant:

void Instance::write(FILE *fout) const {
	fprintf(fout, "#INSTANCE_BEGIN#\n");
	fprintf(fout, "$INSTANCE{\n");
	fprintf(fout, "%d\n", ndims);

	fprintf(fout, "%d\n", nbtypes);

	for (int t = 0; t < nbtypes; t++) {
		for (int i = 0; i < ndims; i++) {
			fprintf(fout, " %d", Ws[t][i]);
		}
		fprintf(fout, " %d", Cs[t]);
		fprintf(fout, " %d\n", Qs[t]);
	}

	fprintf(fout, "%d\n", m);
	int p = 0;
	std::vector<int> rid(items.size());
	for (int it = 0; it < static_cast<int>(items.size()); it++) {
		rid[items[it].id] = it;
	}
	for (int i = 0; i < m; i++) {
		fprintf(fout, "%d %d\n", nopts[i], demands[i]);
		for (int q = 0; q < nopts[i]; q++) {
			for (int j = 0; j < ndims; j++) {
				fprintf(fout, " %d", items[rid[p]][j]);
			}
			fprintf(fout, "\n");
			p++;
		}
	}
	fprintf(fout, "};\n");

	fprintf(fout, "$VTYPE{%c};\n", vtype);

	fprintf(fout, "$CTYPE{");
	for (int i = 0; i < m; i++) {
		if (i) fprintf(fout, ",");
		fprintf(fout, "%c", ctypes[i]);
	}
	fprintf(fout, "};\n");

	fprintf(fout, "$METHOD{%d};\n", method);

	fprintf(fout, "$RELAX{%d};\n", relax_domains);

	fprintf(fout, "$BINARY{%d};\n", binary);

	fprintf(fout, "#INSTANCE_END#\n");
}